

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O2

void __thiscall Wall::Wall(Wall *this)

{
  long lVar1;
  actor_ref aStack_28;
  
  (this->super_actor).context_.object_ = (object_t *)0x0;
  (this->super_actor).self_.object_ = (object_t *)0x0;
  (this->super_actor).handlers_._M_h._M_buckets =
       &(this->super_actor).handlers_._M_h._M_single_bucket;
  (this->super_actor).handlers_._M_h._M_bucket_count = 1;
  (this->super_actor).handlers_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_actor).handlers_._M_h._M_element_count = 0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_actor).handlers_._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_actor).handlers_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_actor).terminating_ = false;
  (this->super_actor)._vptr_actor = (_func_int **)&PTR__Wall_0010f838;
  memset(&this->m_console,0,0x13891);
  acto::actor::handler<msg_ball,Wall,msg_ball_const&>(&this->super_actor,0x103ffa);
  acto::actor::handler<msg_finish,Wall,msg_finish_const&>(&this->super_actor,0x1040e2);
  acto::actor::handler<msg_start,Wall,msg_start_const&>(&this->super_actor,0x104216);
  for (lVar1 = 0x60; lVar1 != 0x138e0; lVar1 = lVar1 + 8) {
    acto::spawn<Player>();
    acto::actor_ref::operator=
              ((actor_ref *)
               ((long)&(((Wall *)(this->m_players + -0xc))->super_actor)._vptr_actor + lVar1),
               &aStack_28);
    acto::actor_ref::~actor_ref(&aStack_28);
  }
  return;
}

Assistant:

Wall()
    : m_counter ( 0 )
    , m_finished( false )
  {
    handler< msg_ball   >( &Wall::do_ball   );
    handler< msg_finish >( &Wall::do_finish );
    handler< msg_start  >( &Wall::do_start  );

    // Инициализация игроков
    for (int i = 0; i < PLAYERS; i++)
      m_players[i] = acto::spawn< Player >();
  }